

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O3

string * __thiscall
Json::JsonArray::toString_abi_cxx11_(string *__return_storage_ptr__,JsonArray *this)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> _S;
  long *local_50 [2];
  long local_40 [2];
  
  __toList(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->super_JsonFormatter).field_0x25 == '\0') {
    pbVar3 = (this->__lstJsonText).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->__lstJsonText).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 != pbVar1) {
      do {
        pcVar2 = (pbVar3->_M_dataplus)._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar2,pcVar2 + pbVar3->_M_string_length);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != pbVar1);
    }
  }
  else {
    JsonFormatter::__formatIndentObject
              (&this->super_JsonFormatter,&this->__lstJsonText,&(this->super_JsonFormatter).__json);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Json::JsonArray::toString() {
    __toList();
    std::string str;
    if (!__format)
        for (auto _S : __lstJsonText) str += _S;
    else
        str = getJson(__lstJsonText);
    return str;
}